

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openxr_program.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_53f39::OpenXrProgram::PollEvents
          (OpenXrProgram *this,bool *exitRenderLoop,bool *requestRestart)

{
  XrAction pXVar1;
  string local_148 [39];
  allocator local_121;
  string local_120 [39];
  allocator local_f9;
  string local_f8 [39];
  allocator local_d1;
  string local_d0 [39];
  allocator local_a9;
  string local_a8 [32];
  undefined1 local_88 [8];
  XrEventDataSessionStateChanged sessionStateChangedEvent;
  string local_50 [32];
  XrEventDataInstanceLossPending *local_30;
  XrEventDataInstanceLossPending *instanceLossPending;
  XrEventDataBaseHeader *event;
  bool *requestRestart_local;
  bool *exitRenderLoop_local;
  OpenXrProgram *this_local;
  
  *requestRestart = false;
  *exitRenderLoop = false;
  event = (XrEventDataBaseHeader *)requestRestart;
  requestRestart_local = exitRenderLoop;
  exitRenderLoop_local = (bool *)this;
  do {
    local_30 = (XrEventDataInstanceLossPending *)TryReadNextEvent(this);
    if (local_30 == (XrEventDataInstanceLossPending *)0x0) {
      return;
    }
    instanceLossPending = local_30;
    switch(local_30->type) {
    case XR_TYPE_EVENT_DATA_INSTANCE_LOSS_PENDING:
      Fmt_abi_cxx11_((char *)local_50,"XrEventDataInstanceLossPending by %lld",local_30->lossTime);
      Log::Write(Warning,local_50);
      std::__cxx11::string::~string((string *)local_50);
      *requestRestart_local = true;
      *(undefined1 *)&event->type = XR_TYPE_API_LAYER_PROPERTIES;
      return;
    case XR_TYPE_EVENT_DATA_SESSION_STATE_CHANGED:
      memcpy(local_88,local_30,0x28);
      HandleSessionStateChangedEvent
                (this,(XrEventDataSessionStateChanged *)local_88,requestRestart_local,(bool *)event)
      ;
      break;
    case XR_TYPE_EVENT_DATA_REFERENCE_SPACE_CHANGE_PENDING:
    default:
      Fmt_abi_cxx11_((char *)local_148,"Ignoring event type %d",(ulong)local_30->type);
      Log::Write(Verbose,local_148);
      std::__cxx11::string::~string((string *)local_148);
      break;
    case XR_TYPE_EVENT_DATA_INTERACTION_PROFILE_CHANGED:
      pXVar1 = (this->m_input).grabAction;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_a8,"Grab",&local_a9);
      LogActionSourceName(this,pXVar1,(string *)local_a8);
      std::__cxx11::string::~string(local_a8);
      std::allocator<char>::~allocator((allocator<char> *)&local_a9);
      pXVar1 = (this->m_input).quitAction;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_d0,"Quit",&local_d1);
      LogActionSourceName(this,pXVar1,(string *)local_d0);
      std::__cxx11::string::~string(local_d0);
      std::allocator<char>::~allocator((allocator<char> *)&local_d1);
      pXVar1 = (this->m_input).poseAction;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_f8,"Pose",&local_f9);
      LogActionSourceName(this,pXVar1,(string *)local_f8);
      std::__cxx11::string::~string(local_f8);
      std::allocator<char>::~allocator((allocator<char> *)&local_f9);
      pXVar1 = (this->m_input).vibrateAction;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_120,"Vibrate",&local_121);
      LogActionSourceName(this,pXVar1,(string *)local_120);
      std::__cxx11::string::~string(local_120);
      std::allocator<char>::~allocator((allocator<char> *)&local_121);
    }
  } while( true );
}

Assistant:

void PollEvents(bool* exitRenderLoop, bool* requestRestart) override {
        *exitRenderLoop = *requestRestart = false;

        // Process all pending messages.
        while (const XrEventDataBaseHeader* event = TryReadNextEvent()) {
            switch (event->type) {
                case XR_TYPE_EVENT_DATA_INSTANCE_LOSS_PENDING: {
                    const auto& instanceLossPending = *reinterpret_cast<const XrEventDataInstanceLossPending*>(event);
                    Log::Write(Log::Level::Warning, Fmt("XrEventDataInstanceLossPending by %lld", instanceLossPending.lossTime));
                    *exitRenderLoop = true;
                    *requestRestart = true;
                    return;
                }
                case XR_TYPE_EVENT_DATA_SESSION_STATE_CHANGED: {
                    auto sessionStateChangedEvent = *reinterpret_cast<const XrEventDataSessionStateChanged*>(event);
                    HandleSessionStateChangedEvent(sessionStateChangedEvent, exitRenderLoop, requestRestart);
                    break;
                }
                case XR_TYPE_EVENT_DATA_INTERACTION_PROFILE_CHANGED:
                    LogActionSourceName(m_input.grabAction, "Grab");
                    LogActionSourceName(m_input.quitAction, "Quit");
                    LogActionSourceName(m_input.poseAction, "Pose");
                    LogActionSourceName(m_input.vibrateAction, "Vibrate");
                    break;
                case XR_TYPE_EVENT_DATA_REFERENCE_SPACE_CHANGE_PENDING:
                default: {
                    Log::Write(Log::Level::Verbose, Fmt("Ignoring event type %d", event->type));
                    break;
                }
            }
        }
    }